

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::emplace<QTimeZonePrivate::Data>
          (QMovableArrayOps<QTimeZonePrivate::Data> *this,qsizetype i,Data *args)

{
  Data **ppDVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qint64 *pqVar4;
  long lVar5;
  Data *pDVar6;
  long lVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  undefined4 uVar11;
  int iVar12;
  qint64 qVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Data *pDVar16;
  int iVar17;
  long in_FS_OFFSET;
  bool bVar18;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  int iStack_4c;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
           super_QArrayDataPointer<QTimeZonePrivate::Data>.d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00410226:
    pDVar8 = (args->abbreviation).d.d;
    pcVar9 = (args->abbreviation).d.ptr;
    (args->abbreviation).d.d = (Data *)0x0;
    (args->abbreviation).d.ptr = (char16_t *)0x0;
    qVar10 = (args->abbreviation).d.size;
    (args->abbreviation).d.size = 0;
    iVar17 = args->daylightTimeOffset;
    qVar13 = args->atMSecsSinceEpoch;
    uVar14 = args->offsetFromUtc;
    uVar15 = args->standardTimeOffset;
    bVar18 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.size != 0;
    QArrayDataPointer<QTimeZonePrivate::Data>::detachAndGrow
              ((QArrayDataPointer<QTimeZonePrivate::Data> *)this,(uint)(i == 0 && bVar18),1,
               (Data **)0x0,(QArrayDataPointer<QTimeZonePrivate::Data> *)0x0);
    pDVar16 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
              super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
    local_58 = (undefined4)qVar13;
    uStack_54 = (undefined4)((ulong)qVar13 >> 0x20);
    if (i != 0 || !bVar18) {
      pDVar3 = pDVar16 + i;
      memmove(pDVar3 + 1,pDVar16 + i,
              ((this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
               super_QArrayDataPointer<QTimeZonePrivate::Data>.size - i) * 0x30);
      (pDVar3->abbreviation).d.d = pDVar8;
      (pDVar3->abbreviation).d.ptr = pcVar9;
      (pDVar3->abbreviation).d.size = qVar10;
      *(undefined4 *)&pDVar3->atMSecsSinceEpoch = local_58;
      *(undefined4 *)((long)&pDVar3->atMSecsSinceEpoch + 4) = uStack_54;
      pDVar3->offsetFromUtc = uVar14;
      pDVar3->standardTimeOffset = uVar15;
      pDVar3->daylightTimeOffset = iVar17;
      goto LAB_004102ee;
    }
    pDVar16[-1].abbreviation.d.d = pDVar8;
    pDVar16[-1].abbreviation.d.ptr = pcVar9;
    pDVar16[-1].abbreviation.d.size = qVar10;
    *(undefined4 *)&pDVar16[-1].atMSecsSinceEpoch = local_58;
    *(undefined4 *)((long)&pDVar16[-1].atMSecsSinceEpoch + 4) = uStack_54;
    pDVar16[-1].offsetFromUtc = uVar14;
    pDVar16[-1].standardTimeOffset = uVar15;
  }
  else {
    lVar7 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
            super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
    if ((lVar7 == i && pDVar6 != (Data *)0x0) &&
       ((pDVar6->super_QArrayData).alloc - lVar7 !=
        ((long)((long)(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                      super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr -
               ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pDVar16 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
                super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
      pDVar8 = (args->abbreviation).d.d;
      (args->abbreviation).d.d = (Data *)0x0;
      pDVar16[lVar7].abbreviation.d.d = pDVar8;
      pcVar9 = (args->abbreviation).d.ptr;
      (args->abbreviation).d.ptr = (char16_t *)0x0;
      pDVar16[lVar7].abbreviation.d.ptr = pcVar9;
      qVar10 = (args->abbreviation).d.size;
      (args->abbreviation).d.size = 0;
      pDVar16[lVar7].abbreviation.d.size = qVar10;
      uVar11 = *(undefined4 *)((long)&args->atMSecsSinceEpoch + 4);
      iVar17 = args->offsetFromUtc;
      iVar12 = args->standardTimeOffset;
      pqVar4 = &pDVar16[lVar7].atMSecsSinceEpoch;
      *(int *)pqVar4 = (int)args->atMSecsSinceEpoch;
      *(undefined4 *)((long)pqVar4 + 4) = uVar11;
      *(int *)(pqVar4 + 1) = iVar17;
      *(int *)((long)pqVar4 + 0xc) = iVar12;
      pDVar16[lVar7].daylightTimeOffset = args->daylightTimeOffset;
      goto LAB_004102ee;
    }
    if (((i != 0) || (pDVar6 == (Data *)0x0)) ||
       ((Data *)((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
        (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
        super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr)) goto LAB_00410226;
    pDVar16 = (this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
              super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
    pDVar8 = (args->abbreviation).d.d;
    (args->abbreviation).d.d = (Data *)0x0;
    pDVar16[-1].abbreviation.d.d = pDVar8;
    pcVar9 = (args->abbreviation).d.ptr;
    (args->abbreviation).d.ptr = (char16_t *)0x0;
    pDVar16[-1].abbreviation.d.ptr = pcVar9;
    qVar10 = (args->abbreviation).d.size;
    (args->abbreviation).d.size = 0;
    pDVar16[-1].abbreviation.d.size = qVar10;
    uVar11 = *(undefined4 *)((long)&args->atMSecsSinceEpoch + 4);
    iVar17 = args->offsetFromUtc;
    iVar12 = args->standardTimeOffset;
    *(int *)&pDVar16[-1].atMSecsSinceEpoch = (int)args->atMSecsSinceEpoch;
    *(undefined4 *)((long)&pDVar16[-1].atMSecsSinceEpoch + 4) = uVar11;
    pDVar16[-1].offsetFromUtc = iVar17;
    pDVar16[-1].standardTimeOffset = iVar12;
    iVar17 = args->daylightTimeOffset;
  }
  pDVar16[-1].daylightTimeOffset = iVar17;
  ppDVar1 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
             super_QArrayDataPointer<QTimeZonePrivate::Data>.ptr;
  *ppDVar1 = *ppDVar1 + -1;
LAB_004102ee:
  pqVar2 = &(this->super_QGenericArrayOps<QTimeZonePrivate::Data>).
            super_QArrayDataPointer<QTimeZonePrivate::Data>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }